

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::OpenDocument(Application *this,char *name)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Document *doc;
  char *name_local;
  Application *this_local;
  Document *doc_00;
  
  uVar1 = (*this->_vptr_Application[3])(this,name);
  if ((uVar1 & 1) != 0) {
    iVar2 = (*this->_vptr_Application[2])();
    doc_00 = (Document *)CONCAT44(extraout_var,iVar2);
    if (doc_00 != (Document *)0x0) {
      DocumentStore::AddDocument(this->_docs,doc_00);
      (*this->_vptr_Application[4])(this,doc_00);
      Document::Open(doc_00);
      (**doc_00->_vptr_Document)();
    }
  }
  return;
}

Assistant:

void Application::OpenDocument(const char* name) {
    if (!CanOpenDocument(name)) {
        // cannot handle this document
        return;
    }

    Document* doc = DoCreateDocument();

    if (doc) {
        _docs->AddDocument(doc);
        AboutToOpenDocument(doc);
        doc->Open();
        doc->DoRead();
    }
}